

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte bVar1;
  bool bVar2;
  char *saved_cursor;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  TokenType TVar6;
  byte *pbVar7;
  byte *pbVar8;
  size_t sVar9;
  long lVar10;
  uint uVar11;
  anon_class_8_1_8991fb9c column;
  string_view name;
  Token local_70;
  
  pbVar4 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  this->token_start_ = (char *)pbVar3;
  if (pbVar3 < pbVar4) {
    do {
      bVar1 = *pbVar3;
      if (bVar1 < 0x61) {
        switch(bVar1) {
        case 9:
        case 10:
        case 0xd:
        case 0x20:
          ReadWhitespace(this);
          break;
        default:
          goto switchD_0018d29c_caseD_b;
        case 0x22:
          GetStringToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x24:
          GetIdToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x28:
          lVar10 = 0;
          pbVar7 = pbVar3;
          do {
            uVar11 = 0xffffffff;
            pbVar8 = pbVar7;
            if (pbVar7 < pbVar4) {
              pbVar8 = pbVar7 + 1;
              this->cursor_ = (char *)pbVar8;
              uVar11 = (uint)*pbVar7;
            }
            if (uVar11 != (int)"(;"[lVar10]) {
              this->cursor_ = (char *)pbVar3;
              lVar10 = 0;
              pbVar7 = pbVar3;
              goto LAB_0018d49b;
            }
            lVar10 = lVar10 + 1;
            pbVar7 = pbVar8;
          } while (lVar10 != 2);
          bVar2 = ReadBlockComment(this);
          if (!bVar2) goto LAB_0018d466;
          break;
        case 0x29:
          this->cursor_ = (char *)(pbVar3 + 1);
          TVar6 = Rpar;
          goto LAB_0018d471;
        case 0x2b:
        case 0x2d:
          pbVar3 = pbVar3 + 1;
          this->cursor_ = (char *)pbVar3;
          if (pbVar3 < pbVar4) {
            bVar1 = *pbVar3;
            if (bVar1 - 0x31 < 9) goto LAB_0018d522;
            if (bVar1 == 0x6e) goto LAB_0018d6b2;
            if (bVar1 == 0x69) goto LAB_0018d6a2;
            if (bVar1 == 0x30) {
              lVar10 = 0;
              pbVar7 = pbVar3;
              goto LAB_0018d655;
            }
          }
          GetReservedToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x30:
          lVar10 = 0;
          pbVar7 = pbVar3;
          goto LAB_0018d53e;
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          goto switchD_0018d29c_caseD_31;
        case 0x3b:
          lVar10 = 0;
          pbVar7 = pbVar3;
          do {
            uVar11 = 0xffffffff;
            pbVar8 = pbVar7;
            if (pbVar7 < pbVar4) {
              pbVar8 = pbVar7 + 1;
              this->cursor_ = (char *)pbVar8;
              uVar11 = (uint)*pbVar7;
            }
            if (uVar11 != (int)";;"[lVar10]) {
              this->cursor_ = (char *)(pbVar3 + 1);
              goto LAB_0018d437;
            }
            lVar10 = lVar10 + 1;
            pbVar7 = pbVar8;
          } while (lVar10 != 2);
          do {
            if (pbVar4 <= pbVar8) goto LAB_0018d466;
            pbVar3 = pbVar8 + 1;
            this->cursor_ = (char *)pbVar3;
            bVar1 = *pbVar8;
            pbVar8 = pbVar3;
          } while (bVar1 != 10);
          this->line_ = this->line_ + 1;
          this->line_start_ = (char *)pbVar3;
        }
      }
      else {
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x61) {
            pcVar5 = "align=";
            sVar9 = 6;
            TVar6 = AlignEqNat;
LAB_0018d5ed:
            name._M_str = pcVar5;
            name._M_len = sVar9;
            GetNameEqNumToken(__return_storage_ptr__,this,name,TVar6);
            return __return_storage_ptr__;
          }
          if (bVar1 == 0x69) {
LAB_0018d6a2:
            GetInfToken(__return_storage_ptr__,this);
            return __return_storage_ptr__;
          }
        }
        else {
          if (bVar1 == 0x6e) {
LAB_0018d6b2:
            GetNanToken(__return_storage_ptr__,this);
            return __return_storage_ptr__;
          }
          if (bVar1 == 0x6f) {
            pcVar5 = "offset=";
            sVar9 = 7;
            TVar6 = OffsetEqNat;
            goto LAB_0018d5ed;
          }
        }
switchD_0018d29c_caseD_b:
        if ((""[(ulong)bVar1 + 1] & 2U) != 0) {
          GetKeywordToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        if ((""[(ulong)bVar1 + 1] & 1U) != 0) {
          ReadReservedChars(this);
          TVar6 = Reserved;
          sVar9 = 0;
          goto LAB_0018d4e5;
        }
        this->cursor_ = (char *)(pbVar3 + 1);
LAB_0018d437:
        Error(this,0x1f6869);
      }
      pbVar4 = (byte *)this->buffer_end_;
      pbVar3 = (byte *)this->cursor_;
      this->token_start_ = (char *)pbVar3;
    } while (pbVar3 < pbVar4);
  }
LAB_0018d466:
  TVar6 = Eof;
LAB_0018d471:
  BareToken(__return_storage_ptr__,this,TVar6);
  return __return_storage_ptr__;
  while (lVar10 = lVar10 + 1, pbVar7 = pbVar8, lVar10 != 2) {
LAB_0018d53e:
    uVar11 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar4) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar11 = (uint)*pbVar7;
    }
    if (uVar11 != (int)", 0x"[lVar10 + 2]) {
      this->cursor_ = (char *)pbVar3;
switchD_0018d29c_caseD_31:
      TVar6 = Last_Literal;
      goto LAB_0018d630;
    }
  }
  TVar6 = Last_Literal;
  goto LAB_0018d57a;
LAB_0018d49b:
  uVar11 = 0xffffffff;
  pbVar8 = pbVar7;
  if (pbVar7 < pbVar4) {
    pbVar8 = pbVar7 + 1;
    this->cursor_ = (char *)pbVar8;
    uVar11 = (uint)*pbVar7;
  }
  if (uVar11 != (int)"(@"[lVar10]) {
    this->cursor_ = (char *)(pbVar3 + 1);
    TVar6 = Lpar;
    goto LAB_0018d471;
  }
  lVar10 = lVar10 + 1;
  pbVar7 = pbVar8;
  if (lVar10 == 2) {
    GetIdToken(&local_70,this);
    sVar9 = 2;
    TVar6 = LparAnn;
LAB_0018d4e5:
    TextToken(__return_storage_ptr__,this,TVar6,sVar9);
    return __return_storage_ptr__;
  }
  goto LAB_0018d49b;
  while (lVar10 = lVar10 + 1, pbVar7 = pbVar8, lVar10 != 2) {
LAB_0018d655:
    uVar11 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar4) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar11 = (uint)*pbVar7;
    }
    if (uVar11 != (int)", 0x"[lVar10 + 2]) {
      this->cursor_ = (char *)pbVar3;
LAB_0018d522:
      TVar6 = Int;
LAB_0018d630:
      GetNumberToken(__return_storage_ptr__,this,TVar6);
      return __return_storage_ptr__;
    }
  }
  TVar6 = Int;
LAB_0018d57a:
  GetHexNumberToken(__return_storage_ptr__,this,TVar6);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken() {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          GetIdToken();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken();

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsIdChar(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}